

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O2

int WebPPictureView(WebPPicture *src,int left,int top,int width,int height,WebPPicture *dst)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint32_t *puVar6;
  long lStack_40;
  int top_local;
  int left_local;
  
  iVar4 = 0;
  if ((dst != (WebPPicture *)0x0 && src != (WebPPicture *)0x0) &&
     (top_local = top, left_local = left,
     iVar2 = AdjustAndCheckRectangle(src,&left_local,&top_local,width,height), iVar2 != 0)) {
    if (src != dst) {
      memcpy(dst,src,0x100);
      WebPPictureResetBuffers(dst);
    }
    dst->width = width;
    dst->height = height;
    lVar3 = (long)left_local;
    iVar4 = 1;
    if (src->use_argb == 0) {
      iVar2 = src->y_stride;
      dst->y = src->y + lVar3 + iVar2 * top_local;
      iVar1 = src->uv_stride;
      lVar5 = (long)((top_local >> 1) * iVar1);
      dst->u = src->u + (left_local >> 1) + lVar5;
      dst->v = src->v + (left_local >> 1) + lVar5;
      dst->y_stride = iVar2;
      dst->uv_stride = iVar1;
      if (src->a == (uint8_t *)0x0) {
        return 1;
      }
      iVar2 = src->a_stride;
      puVar6 = (uint32_t *)(src->a + top_local * iVar2 + lVar3);
      lVar3 = 0x38;
      lStack_40 = 0x30;
    }
    else {
      iVar2 = src->argb_stride;
      puVar6 = src->argb + top_local * iVar2 + lVar3;
      lVar3 = 0x50;
      lStack_40 = 0x48;
    }
    *(uint32_t **)((long)dst->pad1 + lStack_40 + -0x3c) = puVar6;
    *(int *)((long)dst->pad1 + lVar3 + -0x3c) = iVar2;
  }
  return iVar4;
}

Assistant:

int WebPPictureView(const WebPPicture* src,
                    int left, int top, int width, int height,
                    WebPPicture* dst) {
  if (src == NULL || dst == NULL) return 0;

  // verify rectangle position.
  if (!AdjustAndCheckRectangle(src, &left, &top, width, height)) return 0;

  if (src != dst) {  // beware of aliasing! We don't want to leak 'memory_'.
    PictureGrabSpecs(src, dst);
  }
  dst->width = width;
  dst->height = height;
  if (!src->use_argb) {
    dst->y = src->y + top * src->y_stride + left;
    dst->u = src->u + (top >> 1) * src->uv_stride + (left >> 1);
    dst->v = src->v + (top >> 1) * src->uv_stride + (left >> 1);
    dst->y_stride = src->y_stride;
    dst->uv_stride = src->uv_stride;
    if (src->a != NULL) {
      dst->a = src->a + top * src->a_stride + left;
      dst->a_stride = src->a_stride;
    }
  } else {
    dst->argb = src->argb + top * src->argb_stride + left;
    dst->argb_stride = src->argb_stride;
  }
  return 1;
}